

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::ResultBuilder::translateException(ResultBuilder *this)

{
  String *pSVar1;
  char *pcVar2;
  char *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  (this->super_AssertData).m_threw = true;
  anon_unknown_14::translateActiveException();
  pSVar1 = &(this->super_AssertData).m_exception;
  if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
     (pcVar2 = (pSVar1->field_0).data.ptr, pcVar2 != (char *)0x0)) {
    operator_delete__(pcVar2);
  }
  *(undefined8 *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) = local_18;
  (pSVar1->field_0).data.ptr = local_28;
  *(undefined8 *)((long)&(this->super_AssertData).m_exception.field_0 + 8) = uStack_20;
  return;
}

Assistant:

void ResultBuilder::translateException() {
        m_threw     = true;
        m_exception = translateActiveException();
    }